

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O3

idx_t __thiscall duckdb::TaskScheduler::GetNumberOfTasks(TaskScheduler *this)

{
  __int_type _Var1;
  __int_type _Var2;
  ConcurrentQueueProducerTypelessBase *pCVar3;
  pointer pCVar4;
  idx_t iVar5;
  __pointer_type pPVar6;
  long lVar7;
  
  pCVar4 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>::
           operator->(&this->queue);
  pPVar6 = (pCVar4->q).producerListTail._M_b._M_p;
  if (pPVar6 == (__pointer_type)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      _Var1 = (pPVar6->tailIndex).super___atomic_base<unsigned_long>._M_i;
      _Var2 = (pPVar6->headIndex).super___atomic_base<unsigned_long>._M_i;
      lVar7 = _Var1 - _Var2;
      if (_Var2 - _Var1 < 0x8000000000000001) {
        lVar7 = 0;
      }
      iVar5 = iVar5 + lVar7;
      pCVar3 = (pPVar6->super_ConcurrentQueueProducerTypelessBase).next;
      pPVar6 = (__pointer_type)&pCVar3[-1].token;
    } while (pCVar3 != (ConcurrentQueueProducerTypelessBase *)0x0);
  }
  return iVar5;
}

Assistant:

idx_t TaskScheduler::GetNumberOfTasks() const {
#ifndef DUCKDB_NO_THREADS
	return queue->q.size_approx();
#else
	idx_t task_count = 0;
	for (auto &producer : queue->q) {
		task_count += producer.second.size();
	}
	return task_count;
#endif
}